

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_value.cpp
# Opt level: O2

void __thiscall Am_Value::Set_Empty(Am_Value *this)

{
  if (((short)this->type < 0) && ((this->value).wrapper_value != (Am_Wrapper *)0x0)) {
    Am_Wrapper::Release((this->value).wrapper_value);
  }
  (this->value).wrapper_value = (Am_Wrapper *)0x0;
  this->type = 0;
  return;
}

Assistant:

void
Am_Value::Set_Empty()
{
  if (Am_Type_Is_Ref_Counted(type) && value.wrapper_value)
    value.wrapper_value->Release();
  value.voidptr_value = nullptr;
  type = Am_NONE;
}